

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int is_hex(char *p,size_t len)

{
  size_t local_20;
  size_t len_local;
  char *p_local;
  
  local_20 = len;
  len_local = (size_t)p;
  while( true ) {
    if (local_20 == 0) {
      return 1;
    }
    if ((((*(char *)len_local < '0') || ('9' < *(char *)len_local)) &&
        ((*(char *)len_local < 'a' || ('f' < *(char *)len_local)))) &&
       ((*(char *)len_local < 'A' || ('F' < *(char *)len_local)))) break;
    len_local = len_local + 1;
    local_20 = local_20 - 1;
  }
  return 0;
}

Assistant:

static int
is_hex(const char *p, size_t len)
{
	while (len-- > 0) {
		if ((*p >= '0' && *p <= '9')
		    || (*p >= 'a' && *p <= 'f')
		    || (*p >= 'A' && *p <= 'F'))
			++p;
		else
			return (0);
	}
	return (1);
}